

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1angle.cc
# Opt level: O2

ostream * operator<<(ostream *os,S1Angle a)

{
  uint uVar1;
  ostream *poVar2;
  char buffer [13];
  
  uVar1 = snprintf(buffer,0xd,"%.7f");
  if (uVar1 < 0xd) {
    poVar2 = std::operator<<(os,buffer);
    return poVar2;
  }
  poVar2 = std::ostream::_M_insert<double>(a.radians_ * 57.29577951308232);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, S1Angle a) {
  double degrees = a.degrees();
  char buffer[13];
  int sz = snprintf(buffer, sizeof(buffer), "%.7f", degrees);
  if (sz >= 0 && sz < sizeof(buffer)) {
    return os << buffer;
  } else {
    return os << degrees;
  }
}